

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.hpp
# Opt level: O0

bool __thiscall
soplex::
Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateExternalSolution
          (Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,string *solution)

{
  bool bVar1;
  char *__nptr;
  string *in_RSI;
  undefined1 *in_RDI;
  char *tailptr;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  bool local_1;
  
  *in_RDI = 1;
  std::__cxx11::string::operator=((string *)(in_RDI + 8),in_RSI);
  bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (bVar1) {
    local_1 = true;
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (bVar1) {
      local_1 = true;
    }
    else {
      __nptr = (char *)std::__cxx11::string::c_str();
      strtod(__nptr,(char **)&stack0xffffffffffffffe0);
      if (in_stack_ffffffffffffffe0->_M_dataplus == (_Alloc_hider)0x0) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool Validation<R>::updateExternalSolution(const std::string& solution)
{
   validate = true;
   validatesolution = solution;

   if(solution == "+infinity")
   {
      return true;
   }
   else if(solution == "-infinity")
   {
      return true;
   }
   else
   {
      char* tailptr;
      strtod(solution.c_str(), &tailptr);

      if(*tailptr)
      {
         //conversion failed because the input wasn't a number
         return false;
      }
   }

   return true;
}